

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.cpp
# Opt level: O0

Uint32 Diligent::PipelineStateUtils::GetRenderTargetMask(GraphicsPipelineDesc *GraphicsPipeline)

{
  uint local_18;
  uint local_14;
  Uint32 rt;
  Uint32 RTMask;
  GraphicsPipelineDesc *GraphicsPipeline_local;
  
  local_14 = 0;
  for (local_18 = 0; local_18 < GraphicsPipeline->NumRenderTargets; local_18 = local_18 + 1) {
    if ((GraphicsPipeline->RTVFormats[local_18] != TEX_FORMAT_UNKNOWN) &&
       ((GraphicsPipeline->BlendDesc).RenderTargets[local_18].RenderTargetWriteMask !=
        COLOR_MASK_NONE)) {
      local_14 = 1 << ((byte)local_18 & 0x1f) | local_14;
    }
  }
  return local_14;
}

Assistant:

Uint32 GetRenderTargetMask(const GraphicsPipelineDesc& GraphicsPipeline) noexcept
{
    Uint32 RTMask = 0;
    for (Uint32 rt = 0; rt < GraphicsPipeline.NumRenderTargets; ++rt)
    {
        if (GraphicsPipeline.RTVFormats[rt] != TEX_FORMAT_UNKNOWN &&
            GraphicsPipeline.BlendDesc.RenderTargets[rt].RenderTargetWriteMask != COLOR_MASK_NONE)
        {
            RTMask |= (1u << rt);
        }
    }
    return RTMask;
}